

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

bool __thiscall leveldb::Block::Iter::ParseNextKey(Iter *this)

{
  byte *limit;
  byte bVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *p;
  uint32_t non_shared;
  uint32_t value_length;
  uint32_t shared;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  pcVar2 = this->data_;
  uVar3 = ((int)(this->value_).data_ + (int)(this->value_).size_) - (int)pcVar2;
  this->current_ = uVar3;
  uVar6 = (ulong)uVar3;
  uVar4 = (ulong)this->restarts_;
  if (uVar4 <= uVar6) {
    this->current_ = this->restarts_;
    this->restart_index_ = this->num_restarts_;
    return false;
  }
  if (2 < (long)(uVar4 - uVar6)) {
    limit = (byte *)(pcVar2 + uVar4);
    pbVar7 = (byte *)(pcVar2 + uVar6);
    bVar1 = *pbVar7;
    local_1c = (uint)bVar1;
    local_24 = (uint)pbVar7[1];
    local_20 = (uint)pbVar7[2];
    if ((byte)(pbVar7[1] | bVar1 | pbVar7[2]) < 0x80) {
      pbVar7 = pbVar7 + 3;
    }
    else {
      if ((char)bVar1 < '\0') {
        pbVar7 = (byte *)GetVarint32PtrFallback((char *)pbVar7,(char *)limit,&local_1c);
        if (pbVar7 == (byte *)0x0) goto LAB_00122a82;
      }
      else {
        pbVar7 = pbVar7 + 1;
      }
      if ((pbVar7 < limit) && (-1 < (char)*pbVar7)) {
        p = pbVar7 + 1;
        local_24 = (int)(char)*pbVar7;
      }
      else {
        p = (byte *)GetVarint32PtrFallback((char *)pbVar7,(char *)limit,&local_24);
        if (p == (byte *)0x0) goto LAB_00122a82;
      }
      if ((p < limit) && (-1 < (char)*p)) {
        pbVar7 = p + 1;
        local_20 = (int)(char)*p;
      }
      else {
        pbVar7 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_20);
        if (pbVar7 == (byte *)0x0) goto LAB_00122a82;
      }
    }
    if ((local_20 + local_24 <= (uint)((int)limit - (int)pbVar7)) &&
       ((ulong)local_1c <= (this->key_)._M_string_length)) {
      std::__cxx11::string::resize((ulong)&this->key_,(char)local_1c);
      std::__cxx11::string::append((char *)&this->key_,(ulong)pbVar7);
      (this->value_).data_ = (char *)(pbVar7 + local_24);
      (this->value_).size_ = (ulong)local_20;
      uVar3 = this->restart_index_ + 1;
      if (this->num_restarts_ <= uVar3) {
        return true;
      }
      puVar5 = (uint *)(this->data_ + (ulong)this->restarts_ + (ulong)uVar3 * 4);
      do {
        if (this->current_ <= *puVar5) {
          return true;
        }
        this->restart_index_ = uVar3;
        uVar3 = uVar3 + 1;
        puVar5 = puVar5 + 1;
      } while (this->num_restarts_ != uVar3);
      return true;
    }
  }
LAB_00122a82:
  CorruptionError(this);
  return false;
}

Assistant:

bool ParseNextKey() {
    current_ = (uint32_t)NextEntryOffset();
    const char* p = data_ + current_;
    const char* limit = data_ + restarts_;  // Restarts come right after data
    if (p >= limit) {
      // No more entries to return.  Mark as invalid.
      current_ = restarts_;
      restart_index_ = num_restarts_;
      return false;
    }

    // Decode next entry
    uint32_t shared, non_shared, value_length;
    p = DecodeEntry(p, limit, &shared, &non_shared, &value_length);
    if (p == nullptr || key_.size() < shared) {
      CorruptionError();
      return false;
    } else {
      key_.resize(shared);
      key_.append(p, non_shared);
      value_ = Slice(p + non_shared, value_length);
      while (restart_index_ + 1 < num_restarts_ &&
             GetRestartPoint(restart_index_ + 1) < current_) {
        ++restart_index_;
      }
      return true;
    }
  }